

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QItemViewPaintPairs * __thiscall
QTreeViewPrivate::draggablePaintPairs(QTreeViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  bool bVar1;
  int iVar2;
  QTreeView *pQVar3;
  const_iterator o;
  QModelIndex *this_00;
  QRect *in_RCX;
  QModelIndexList *in_RDX;
  QTreeViewPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *idx;
  QModelIndexList *__range1;
  QTreeView *q;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList list;
  parameter_type in_stack_ffffffffffffff48;
  QTreeView *in_stack_ffffffffffffff50;
  bool local_a1;
  QModelIndex *pQVar4;
  QTreeViewPrivate *this_01;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  this_01 = in_RSI;
  pQVar3 = q_func(in_RSI);
  bVar1 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f60c2);
  if (bVar1) {
    QAbstractItemViewPrivate::draggablePaintPairs
              (&this_01->super_QAbstractItemViewPrivate,in_RDX,in_RCX);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x8f6120);
    local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_ffffffffffffff50);
    o = QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_ffffffffffffff50);
    while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_28,o), bVar1) {
      this_00 = QList<QModelIndex>::const_iterator::operator*(&local_28);
      iVar2 = QModelIndex::column(this_00);
      local_a1 = false;
      if (0 < iVar2) {
        in_stack_ffffffffffffff50 = pQVar3;
        QModelIndex::row(this_00);
        QModelIndex::parent(in_RDI);
        local_a1 = QTreeView::isFirstColumnSpanned
                             ((QTreeView *)in_RSI,(int)((ulong)pQVar4 >> 0x20),in_RDI);
      }
      if (local_a1 == false) {
        QList<QModelIndex>::operator<<
                  ((QList<QModelIndex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      QList<QModelIndex>::const_iterator::operator++(&local_28);
    }
    QAbstractItemViewPrivate::draggablePaintPairs
              (&this_01->super_QAbstractItemViewPrivate,in_RDX,in_RCX);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8f6278);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QItemViewPaintPairs *)pQVar4;
}

Assistant:

QItemViewPaintPairs QTreeViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QTreeView);
    if (spanningIndexes.isEmpty())
        return QAbstractItemViewPrivate::draggablePaintPairs(indexes, r);
    QModelIndexList list;
    for (const QModelIndex &idx : indexes) {
        if (idx.column() > 0 && q->isFirstColumnSpanned(idx.row(), idx.parent()))
            continue;
        list << idx;
    }
    return QAbstractItemViewPrivate::draggablePaintPairs(list, r);
}